

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O1

string * __thiscall
booster::locale::impl_std::utf8_converter::convert_abi_cxx11_
          (string *__return_storage_ptr__,utf8_converter *this,conversion_type how,char *begin,
          char *end,int param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer begin_00;
  ctype *pcVar2;
  vector<wchar_t,_std::allocator<wchar_t>_> res;
  wstring tmp;
  allocator_type local_89;
  string local_88;
  vector<wchar_t,_std::allocator<wchar_t>_> local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  if (how - upper_case < 3) {
    paVar1 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"UTF-8","");
    conv::to_utf<wchar_t>(&local_50,begin,end,&local_88,default_method);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pcVar2 = std::use_facet<std::ctype<wchar_t>>(&this->base_);
    local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
              (&local_68,local_50._M_string_length + 1,(value_type_conflict1 *)&local_88,&local_89);
    begin_00 = local_68.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_50._M_string_length != 0) {
      memmove(local_68.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
              super__Vector_impl_data._M_start,local_50._M_dataplus._M_p,
              local_50._M_string_length * 4);
    }
    (**(code **)((ulong)(how != upper_case) * 0x10 + 0x38 + *(long *)pcVar2))
              (pcVar2,begin_00,begin_00 + local_50._M_string_length);
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"UTF-8","");
    conv::from_utf<wchar_t>
              (__return_storage_ptr__,begin_00,begin_00 + local_50._M_string_length,&local_88,
               default_method);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_68.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
        super__Vector_impl_data._M_start != (wchar_t *)0x0) {
      operator_delete(local_68.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,begin,end);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case upper_case:
        case lower_case:
        case case_folding:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                wctype_type const &ct=std::use_facet<wctype_type>(base_);
                size_t len = tmp.size();
                std::vector<wchar_t> res(len+1,0);
                wchar_t *lbegin = &res[0];
                std::copy(tmp.c_str(),tmp.c_str()+len,lbegin);
                if(how == upper_case)
                    ct.toupper(lbegin,lbegin+len);
                else
                    ct.tolower(lbegin,lbegin+len);
                return conv::from_utf<wchar_t>(lbegin,lbegin+len,"UTF-8");
            }
        default:
            return std::string(begin,end-begin);
        }
    }